

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeEnumDefinition(ExpressionContext *ctx,SynEnumDefinition *syntax)

{
  InplaceStr *pIVar1;
  ScopeData *target;
  Allocator *pAVar2;
  ScopeData *pSVar3;
  IntrusiveList<ExprVariableDefinition> arguments_00;
  IntrusiveList<ExprVariableDefinition> arguments_01;
  IntrusiveList<ExprBase> expressions_00;
  IntrusiveList<ExprBase> expressions_01;
  IntrusiveList<MatchData> generics;
  IntrusiveList<MatchData> generics_00;
  TypeFunction *pTVar4;
  Allocator *pAVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  TypeBase *pTVar9;
  TypeEnum *pTVar10;
  SynIdentifier *pSVar11;
  FunctionData *pFVar12;
  TypeRef *pTVar13;
  SmallArray<ArgumentData,_4U> *pSVar14;
  ArgumentData *pAVar15;
  ExprVariableAccess *pEVar16;
  ExprTypeCast *pEVar17;
  ExprReturn *pEVar18;
  ExprBase *pEVar19;
  ExprFunctionDefinition *pEVar20;
  ExprBase *closures;
  ExprEnumDefinition *this;
  char *in_R8;
  char *pcVar21;
  InplaceStr name;
  ArrayView<ArgumentData> arguments_02;
  InplaceStr name_00;
  ArrayView<ArgumentData> arguments_03;
  ArrayView<ArgumentData> arguments_04;
  InplaceStr name_01;
  ArrayView<ArgumentData> arguments_05;
  ExprBase *cast_1;
  ExprBase *access_1;
  IntrusiveList<ExprBase> expressions_1;
  ExprVariableDefinition *contextArgumentDefinition_1;
  undefined4 local_430;
  undefined1 auStack_428 [8];
  IntrusiveList<ExprVariableDefinition> variables_1;
  uint local_3fc;
  undefined1 auStack_3f8 [4];
  uint i_1;
  MatchData *pMStack_3f0;
  FunctionData *local_3e8;
  FunctionData *function_1;
  undefined4 local_3d8;
  TypeFunction *local_3d0;
  TypeFunction *typeFunction_1;
  char *pcStack_3c0;
  SynIdentifier *local_3b8;
  SynIdentifier *functionNameIdentifier_1;
  ArgumentData local_3a0;
  undefined1 local_370 [8];
  SmallArray<ArgumentData,_1U> arguments_1;
  ExprBase *cast;
  ExprBase *access;
  IntrusiveList<ExprBase> expressions;
  ExprVariableDefinition *contextArgumentDefinition;
  undefined4 local_2d0;
  undefined1 auStack_2c8 [8];
  IntrusiveList<ExprVariableDefinition> variables;
  uint local_29c;
  undefined1 auStack_298 [4];
  uint i;
  MatchData *pMStack_290;
  FunctionData *local_288;
  FunctionData *function;
  undefined4 local_278;
  TypeFunction *local_270;
  TypeFunction *typeFunction;
  SynIdentifier *local_258;
  SynIdentifier *functionNameIdentifier;
  ArgumentData local_240;
  undefined1 local_210 [8];
  SmallArray<ArgumentData,_1U> arguments;
  SynBase *syntaxInternal;
  uint traceDepth;
  bool prevErrorHandlerNested;
  jmp_buf prevErrorHandler;
  ExprBase *castToEnum;
  ExprBase *castToInt;
  ScopeData *scope;
  SynIdentifier local_a8;
  TypeEnum *local_58;
  TypeEnum *enumType;
  char *local_48;
  undefined1 auStack_40 [8];
  InplaceStr typeName;
  SynEnumDefinition *syntax_local;
  ExpressionContext *ctx_local;
  
  typeName.end = (syntax->name->name).begin;
  name.end = in_R8;
  name.begin = (syntax->name->name).end;
  anon_unknown.dwarf_e7629::CheckTypeConflict
            ((anon_unknown_dwarf_e7629 *)ctx,(ExpressionContext *)syntax,(SynBase *)typeName.end,
             name);
  pIVar1 = &syntax->name->name;
  enumType = (TypeEnum *)pIVar1->begin;
  local_48 = (syntax->name->name).end;
  _auStack_40 = GetTypeNameInScope(ctx,ctx->scope,*pIVar1);
  uVar7 = InplaceStr::hash((InplaceStr *)auStack_40);
  pTVar9 = anon_unknown.dwarf_e7629::LookupTypeByName(ctx,uVar7);
  if (pTVar9 != (TypeBase *)0x0) {
    anon_unknown.dwarf_e7629::Stop
              (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
               (ulong)(uint)((int)(syntax->name->name).end - (int)(syntax->name->name).begin),
               (syntax->name->name).begin);
  }
  pTVar10 = ExpressionContext::get<TypeEnum>(ctx);
  SynIdentifier::SynIdentifier(&local_a8,syntax->name,_auStack_40);
  TypeEnum::TypeEnum(pTVar10,&local_a8,&syntax->super_SynBase,ctx->scope);
  SynIdentifier::~SynIdentifier(&local_a8);
  local_58 = pTVar10;
  ExpressionContext::AddType(ctx,(TypeBase *)pTVar10);
  ExpressionContext::PushScope(ctx,(TypeBase *)local_58);
  (local_58->super_TypeStruct).typeScope = ctx->scope;
  AnalyzeEnumConstants
            (ctx,(TypeBase *)local_58,syntax->values,&(local_58->super_TypeStruct).constants);
  (local_58->super_TypeStruct).super_TypeBase.alignment = ctx->typeInt->alignment;
  ExpressionContext::PopScope(ctx,SCOPE_TYPE);
  target = ctx->scope;
  ExpressionContext::SwitchToScopeAtPoint(ctx,ctx->globalScope,(SynBase *)0x0);
  prevErrorHandler[0].__saved_mask.__val[0xf] = 0;
  memcpy(&traceDepth,ctx->errorHandler,200);
  bVar6 = (bool)(ctx->errorHandlerNested & 1);
  ctx->errorHandlerNested = true;
  uVar7 = NULLC::TraceGetDepth();
  iVar8 = _setjmp((__jmp_buf_tag *)ctx->errorHandler);
  if (iVar8 == 0) {
    arguments.allocator = (Allocator *)ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase);
    SmallArray<ArgumentData,_1U>::SmallArray
              ((SmallArray<ArgumentData,_1U> *)local_210,ctx->allocator);
    pAVar2 = arguments.allocator;
    pSVar11 = ExpressionContext::get<SynIdentifier>(ctx);
    InplaceStr::InplaceStr((InplaceStr *)&functionNameIdentifier,"$x");
    SynIdentifier::SynIdentifier(pSVar11,_functionNameIdentifier);
    ArgumentData::ArgumentData
              (&local_240,(SynBase *)pAVar2,false,pSVar11,(TypeBase *)local_58,(ExprBase *)0x0);
    SmallArray<ArgumentData,_1U>::push_back((SmallArray<ArgumentData,_1U> *)local_210,&local_240);
    pSVar11 = ExpressionContext::get<SynIdentifier>(ctx);
    InplaceStr::InplaceStr((InplaceStr *)&typeFunction,"int");
    SynIdentifier::SynIdentifier(pSVar11,_typeFunction);
    pAVar2 = arguments.allocator;
    pTVar9 = ctx->typeInt;
    local_258 = pSVar11;
    ArrayView<ArgumentData>::ArrayView<1u>
              ((ArrayView<ArgumentData> *)&function,(SmallArray<ArgumentData,_1U> *)local_210);
    arguments_02._12_4_ = 0;
    arguments_02.data = (ArgumentData *)function;
    arguments_02.count = local_278;
    local_270 = ExpressionContext::GetFunctionType(ctx,(SynBase *)pAVar2,pTVar9,arguments_02);
    pFVar12 = ExpressionContext::get<FunctionData>(ctx);
    pAVar5 = arguments.allocator;
    pTVar4 = local_270;
    pAVar2 = ctx->allocator;
    pSVar3 = ctx->scope;
    pTVar13 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    pSVar11 = local_258;
    IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)auStack_298);
    uVar7 = ctx->uniqueFunctionId;
    ctx->uniqueFunctionId = uVar7 + 1;
    pcVar21 = (char *)0x0;
    generics.tail = pMStack_290;
    generics.head = _auStack_298;
    FunctionData::FunctionData
              (pFVar12,pAVar2,(SynBase *)pAVar5,pSVar3,false,false,false,pTVar4,
               &pTVar13->super_TypeBase,pSVar11,generics,uVar7);
    local_29c = 0;
    local_288 = pFVar12;
    while( true ) {
      uVar7 = SmallArray<ArgumentData,_1U>::size((SmallArray<ArgumentData,_1U> *)local_210);
      if (uVar7 <= local_29c) break;
      pSVar14 = &local_288->arguments;
      pAVar15 = SmallArray<ArgumentData,_1U>::operator[]
                          ((SmallArray<ArgumentData,_1U> *)local_210,local_29c);
      SmallArray<ArgumentData,_4U>::push_back(pSVar14,pAVar15);
      local_29c = local_29c + 1;
    }
    variables.tail = (ExprVariableDefinition *)(local_288->name->name).begin;
    name_00.end = pcVar21;
    name_00.begin = (local_288->name->name).end;
    anon_unknown.dwarf_e7629::CheckFunctionConflict
              ((anon_unknown_dwarf_e7629 *)ctx,(ExpressionContext *)syntax,(SynBase *)variables.tail
               ,name_00);
    ExpressionContext::AddFunction(ctx,local_288);
    ExpressionContext::PushScope(ctx,local_288);
    local_288->functionScope = ctx->scope;
    IntrusiveList<ExprVariableDefinition>::IntrusiveList
              ((IntrusiveList<ExprVariableDefinition> *)auStack_2c8);
    pAVar2 = arguments.allocator;
    pFVar12 = local_288;
    ArrayView<ArgumentData>::ArrayView<1u>
              ((ArrayView<ArgumentData> *)&contextArgumentDefinition,
               (SmallArray<ArgumentData,_1U> *)local_210);
    arguments_03._12_4_ = 0;
    arguments_03.data = (ArgumentData *)contextArgumentDefinition;
    arguments_03.count = local_2d0;
    CreateFunctionArgumentVariables
              (ctx,(SynBase *)pAVar2,pFVar12,arguments_03,
               (IntrusiveList<ExprVariableDefinition> *)auStack_2c8);
    expressions.tail =
         &CreateFunctionContextArgument(ctx,(SynBase *)arguments.allocator,local_288)->
          super_ExprBase;
    local_288->argumentsSize = local_288->functionScope->dataSize;
    IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&access);
    pEVar16 = ExpressionContext::get<ExprVariableAccess>(ctx);
    ExprVariableAccess::ExprVariableAccess
              (pEVar16,(SynBase *)arguments.allocator,(TypeBase *)local_58,
               (variables.head)->variable->variable);
    pEVar17 = ExpressionContext::get<ExprTypeCast>(ctx);
    ExprTypeCast::ExprTypeCast
              (pEVar17,(SynBase *)arguments.allocator,ctx->typeInt,&pEVar16->super_ExprBase,
               EXPR_CAST_REINTERPRET);
    pEVar18 = ExpressionContext::get<ExprReturn>(ctx);
    pAVar2 = arguments.allocator;
    pTVar9 = ctx->typeVoid;
    pEVar19 = CreateFunctionUpvalueClose(ctx,(SynBase *)arguments.allocator,local_288,ctx->scope);
    ExprReturn::ExprReturn
              (pEVar18,(SynBase *)pAVar2,pTVar9,&pEVar17->super_ExprBase,(ExprBase *)0x0,pEVar19);
    IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&access,&pEVar18->super_ExprBase);
    ClosePendingUpvalues(ctx,local_288);
    ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
    pEVar20 = ExpressionContext::get<ExprFunctionDefinition>(ctx);
    arguments_1.allocator = (Allocator *)access;
    arguments_00.tail = variables.head;
    arguments_00.head = (ExprVariableDefinition *)auStack_2c8;
    expressions_00.tail = expressions.head;
    expressions_00.head = access;
    ExprFunctionDefinition::ExprFunctionDefinition
              (pEVar20,(SynBase *)arguments.allocator,&local_288->type->super_TypeBase,local_288,
               (ExprVariableDefinition *)expressions.tail,arguments_00,(ExprBase *)0x0,
               expressions_00,(ExprVariableDefinition *)0x0,(VariableData *)0x0);
    local_288->declaration = &pEVar20->super_ExprBase;
    SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&local_288->declaration);
    pEVar19 = local_288->declaration;
    SmallArray<ArgumentData,_1U>::~SmallArray((SmallArray<ArgumentData,_1U> *)local_210);
    SmallArray<ArgumentData,_1U>::SmallArray
              ((SmallArray<ArgumentData,_1U> *)local_370,ctx->allocator);
    pAVar2 = arguments.allocator;
    pSVar11 = ExpressionContext::get<SynIdentifier>(ctx);
    InplaceStr::InplaceStr((InplaceStr *)&functionNameIdentifier_1,"$x");
    SynIdentifier::SynIdentifier(pSVar11,_functionNameIdentifier_1);
    ArgumentData::ArgumentData
              (&local_3a0,(SynBase *)pAVar2,false,pSVar11,ctx->typeInt,(ExprBase *)0x0);
    SmallArray<ArgumentData,_1U>::push_back((SmallArray<ArgumentData,_1U> *)local_370,&local_3a0);
    pSVar11 = ExpressionContext::get<SynIdentifier>(ctx);
    typeFunction_1 = (TypeFunction *)auStack_40;
    pcStack_3c0 = typeName.begin;
    SynIdentifier::SynIdentifier(pSVar11,_auStack_40);
    pTVar10 = local_58;
    pAVar2 = arguments.allocator;
    local_3b8 = pSVar11;
    ArrayView<ArgumentData>::ArrayView<1u>
              ((ArrayView<ArgumentData> *)&function_1,(SmallArray<ArgumentData,_1U> *)local_370);
    arguments_04._12_4_ = 0;
    arguments_04.data = (ArgumentData *)function_1;
    arguments_04.count = local_3d8;
    local_3d0 = ExpressionContext::GetFunctionType
                          (ctx,(SynBase *)pAVar2,(TypeBase *)pTVar10,arguments_04);
    pFVar12 = ExpressionContext::get<FunctionData>(ctx);
    pAVar5 = arguments.allocator;
    pTVar4 = local_3d0;
    pAVar2 = ctx->allocator;
    pSVar3 = ctx->scope;
    pTVar13 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    pSVar11 = local_3b8;
    IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)auStack_3f8);
    uVar7 = ctx->uniqueFunctionId;
    ctx->uniqueFunctionId = uVar7 + 1;
    pcVar21 = (char *)0x0;
    generics_00.tail = pMStack_3f0;
    generics_00.head = _auStack_3f8;
    FunctionData::FunctionData
              (pFVar12,pAVar2,(SynBase *)pAVar5,pSVar3,false,false,false,pTVar4,
               &pTVar13->super_TypeBase,pSVar11,generics_00,uVar7);
    local_3fc = 0;
    local_3e8 = pFVar12;
    while( true ) {
      uVar7 = SmallArray<ArgumentData,_1U>::size((SmallArray<ArgumentData,_1U> *)local_370);
      if (uVar7 <= local_3fc) break;
      pSVar14 = &local_3e8->arguments;
      pAVar15 = SmallArray<ArgumentData,_1U>::operator[]
                          ((SmallArray<ArgumentData,_1U> *)local_370,local_3fc);
      SmallArray<ArgumentData,_4U>::push_back(pSVar14,pAVar15);
      local_3fc = local_3fc + 1;
    }
    variables_1.tail = (ExprVariableDefinition *)(local_3e8->name->name).begin;
    name_01.end = pcVar21;
    name_01.begin = (local_3e8->name->name).end;
    anon_unknown.dwarf_e7629::CheckFunctionConflict
              ((anon_unknown_dwarf_e7629 *)ctx,(ExpressionContext *)syntax,
               (SynBase *)variables_1.tail,name_01);
    ExpressionContext::AddFunction(ctx,local_3e8);
    ExpressionContext::PushScope(ctx,local_3e8);
    local_3e8->functionScope = ctx->scope;
    IntrusiveList<ExprVariableDefinition>::IntrusiveList
              ((IntrusiveList<ExprVariableDefinition> *)auStack_428);
    pAVar2 = arguments.allocator;
    pFVar12 = local_3e8;
    ArrayView<ArgumentData>::ArrayView<1u>
              ((ArrayView<ArgumentData> *)&contextArgumentDefinition_1,
               (SmallArray<ArgumentData,_1U> *)local_370);
    arguments_05._12_4_ = 0;
    arguments_05.data = (ArgumentData *)contextArgumentDefinition_1;
    arguments_05.count = local_430;
    CreateFunctionArgumentVariables
              (ctx,(SynBase *)pAVar2,pFVar12,arguments_05,
               (IntrusiveList<ExprVariableDefinition> *)auStack_428);
    expressions_1.tail =
         &CreateFunctionContextArgument(ctx,(SynBase *)arguments.allocator,local_3e8)->
          super_ExprBase;
    local_3e8->argumentsSize = local_3e8->functionScope->dataSize;
    IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&access_1);
    pEVar16 = ExpressionContext::get<ExprVariableAccess>(ctx);
    ExprVariableAccess::ExprVariableAccess
              (pEVar16,(SynBase *)arguments.allocator,ctx->typeInt,
               (variables_1.head)->variable->variable);
    pEVar17 = ExpressionContext::get<ExprTypeCast>(ctx);
    ExprTypeCast::ExprTypeCast
              (pEVar17,(SynBase *)arguments.allocator,(TypeBase *)local_58,&pEVar16->super_ExprBase,
               EXPR_CAST_REINTERPRET);
    pEVar18 = ExpressionContext::get<ExprReturn>(ctx);
    pAVar2 = arguments.allocator;
    pTVar9 = ctx->typeVoid;
    closures = CreateFunctionUpvalueClose(ctx,(SynBase *)arguments.allocator,local_3e8,ctx->scope);
    ExprReturn::ExprReturn
              (pEVar18,(SynBase *)pAVar2,pTVar9,&pEVar17->super_ExprBase,(ExprBase *)0x0,closures);
    IntrusiveList<ExprBase>::push_back
              ((IntrusiveList<ExprBase> *)&access_1,&pEVar18->super_ExprBase);
    ClosePendingUpvalues(ctx,local_3e8);
    ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
    pEVar20 = ExpressionContext::get<ExprFunctionDefinition>(ctx);
    arguments_01.tail = variables_1.head;
    arguments_01.head = (ExprVariableDefinition *)auStack_428;
    expressions_01.tail = expressions_1.head;
    expressions_01.head = access_1;
    ExprFunctionDefinition::ExprFunctionDefinition
              (pEVar20,(SynBase *)arguments.allocator,&local_3e8->type->super_TypeBase,local_3e8,
               (ExprVariableDefinition *)expressions_1.tail,arguments_01,(ExprBase *)0x0,
               expressions_01,(ExprVariableDefinition *)0x0,(VariableData *)0x0);
    local_3e8->declaration = &pEVar20->super_ExprBase;
    SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&local_3e8->declaration);
    prevErrorHandler[0].__saved_mask.__val[0xf] = (unsigned_long)local_3e8->declaration;
    SmallArray<ArgumentData,_1U>::~SmallArray((SmallArray<ArgumentData,_1U> *)local_370);
    ExpressionContext::SwitchToScopeAtPoint(ctx,target,(SynBase *)0x0);
    memcpy(ctx->errorHandler,&traceDepth,200);
    ctx->errorHandlerNested = bVar6;
    this = ExpressionContext::get<ExprEnumDefinition>(ctx);
    ExprEnumDefinition::ExprEnumDefinition
              (this,&syntax->super_SynBase,ctx->typeVoid,local_58,pEVar19,
               (ExprBase *)prevErrorHandler[0].__saved_mask.__val[0xf]);
    return &this->super_ExprBase;
  }
  NULLC::TraceLeaveTo(uVar7);
  ExpressionContext::SwitchToScopeAtPoint(ctx,target,(SynBase *)0x0);
  memcpy(ctx->errorHandler,&traceDepth,200);
  ctx->errorHandlerNested = bVar6;
  longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
}

Assistant:

ExprBase* AnalyzeEnumDefinition(ExpressionContext &ctx, SynEnumDefinition *syntax)
{
	CheckTypeConflict(ctx, syntax, syntax->name->name);

	InplaceStr typeName = GetTypeNameInScope(ctx, ctx.scope, syntax->name->name);

	if(LookupTypeByName(ctx, typeName.hash()) != NULL)
		Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(syntax->name->name));

	TypeEnum *enumType = new (ctx.get<TypeEnum>()) TypeEnum(SynIdentifier(syntax->name, typeName), syntax, ctx.scope);

	ctx.AddType(enumType);

	ctx.PushScope(enumType);

	enumType->typeScope = ctx.scope;

	AnalyzeEnumConstants(ctx, enumType, syntax->values, enumType->constants);

	enumType->alignment = ctx.typeInt->alignment;

	ctx.PopScope(SCOPE_TYPE);
	
	ScopeData *scope = ctx.scope;

	// Switch to global scope
	ctx.SwitchToScopeAtPoint(ctx.globalScope, NULL);

	ExprBase *castToInt = NULL;
	ExprBase *castToEnum = NULL;

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		SynBase *syntaxInternal = ctx.MakeInternal(syntax);

		// Create conversion operator int int(enum_type)
		{
			SmallArray<ArgumentData, 1> arguments(ctx.allocator);
			arguments.push_back(ArgumentData(syntaxInternal, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$x")), enumType, NULL));

			SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("int"));

			TypeFunction *typeFunction = ctx.GetFunctionType(syntaxInternal, ctx.typeInt, arguments);

			FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, syntaxInternal, ctx.scope, false, false, false, typeFunction, ctx.GetReferenceType(ctx.typeVoid), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

			// Fill in argument data
			for(unsigned i = 0; i < arguments.size(); i++)
				function->arguments.push_back(arguments[i]);

			CheckFunctionConflict(ctx, syntax, function->name->name);

			ctx.AddFunction(function);

			ctx.PushScope(function);

			function->functionScope = ctx.scope;

			IntrusiveList<ExprVariableDefinition> variables;

			CreateFunctionArgumentVariables(ctx, syntaxInternal, function, arguments, variables);

			ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, syntaxInternal, function);

			function->argumentsSize = function->functionScope->dataSize;

			IntrusiveList<ExprBase> expressions;

			ExprBase *access = new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(syntaxInternal, enumType, variables.tail->variable->variable);
			ExprBase *cast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(syntaxInternal, ctx.typeInt, access, EXPR_CAST_REINTERPRET);

			expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(syntaxInternal, ctx.typeVoid, cast, NULL, CreateFunctionUpvalueClose(ctx, syntaxInternal, function, ctx.scope)));

			ClosePendingUpvalues(ctx, function);

			ctx.PopScope(SCOPE_FUNCTION);

			function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(syntaxInternal, function->type, function, contextArgumentDefinition, variables, NULL, expressions, NULL, NULL);

			ctx.definitions.push_back(function->declaration);

			castToInt = function->declaration;
		}

		// Create conversion operator enum_type enum_type(int)
		{
			SmallArray<ArgumentData, 1> arguments(ctx.allocator);
			arguments.push_back(ArgumentData(syntaxInternal, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$x")), ctx.typeInt, NULL));

			SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(typeName);

			TypeFunction *typeFunction = ctx.GetFunctionType(syntaxInternal, enumType, arguments);

			FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, syntaxInternal, ctx.scope, false, false, false, typeFunction, ctx.GetReferenceType(ctx.typeVoid), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

			// Fill in argument data
			for(unsigned i = 0; i < arguments.size(); i++)
				function->arguments.push_back(arguments[i]);

			CheckFunctionConflict(ctx, syntax, function->name->name);

			ctx.AddFunction(function);

			ctx.PushScope(function);

			function->functionScope = ctx.scope;

			IntrusiveList<ExprVariableDefinition> variables;

			CreateFunctionArgumentVariables(ctx, syntaxInternal, function, arguments, variables);

			ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, syntaxInternal, function);

			function->argumentsSize = function->functionScope->dataSize;

			IntrusiveList<ExprBase> expressions;

			ExprBase *access = new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(syntaxInternal, ctx.typeInt, variables.tail->variable->variable);
			ExprBase *cast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(syntaxInternal, enumType, access, EXPR_CAST_REINTERPRET);

			expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(syntaxInternal, ctx.typeVoid, cast, NULL, CreateFunctionUpvalueClose(ctx, syntaxInternal, function, ctx.scope)));

			ClosePendingUpvalues(ctx, function);

			ctx.PopScope(SCOPE_FUNCTION);

			function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(syntaxInternal, function->type, function, contextArgumentDefinition, variables, NULL, expressions, NULL, NULL);

			ctx.definitions.push_back(function->declaration);

			castToEnum = function->declaration;
		}
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		longjmp(ctx.errorHandler, 1);
	}

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	return new (ctx.get<ExprEnumDefinition>()) ExprEnumDefinition(syntax, ctx.typeVoid, enumType, castToInt, castToEnum);
}